

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestEventFilter.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
(anonymous_namespace)::filterEvents_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,Session *session,EventFilter *filter)

{
  size_t __n;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  element_type *peVar2;
  _Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar4;
  Channel *__tmp;
  size_t sVar5;
  shared_ptr<binlog::Session::Channel> *psVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *extraout_RAX;
  undefined **ppuVar7;
  undefined8 uVar8;
  _anonymous_namespace_ *__n_00;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  shared_ptr<binlog::Session::Channel> *psVar12;
  uint64_t uVar13;
  shared_ptr<binlog::Session::Channel> *psVar14;
  iterator __first;
  void *pvVar15;
  void *pvVar16;
  void *__buf;
  bool bVar17;
  long local_b0;
  pthread_mutex_t *local_a0;
  int local_98;
  FilterAdapter local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  _anonymous_namespace_ *local_50;
  shared_ptr<binlog::Session::Channel> *local_48;
  void *local_40;
  shared_ptr<binlog::Session::Channel> *local_38;
  
  local_88.stream.super_EntryStream._vptr_EntryStream = (_func_int **)&PTR__TestStream_001ebca8;
  local_88.stream.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.stream.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.stream.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.stream.readPos = 0;
  local_88.filter = (EventFilter *)session;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar4 != 0) {
    uVar8 = std::__throw_system_error(iVar4);
    pthread_mutex_unlock(local_a0);
    local_88.stream.super_EntryStream._vptr_EntryStream = (_func_int **)&PTR__TestStream_001ebca8;
    if (local_88.stream.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.stream.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl
                      .super__Vector_impl_data._M_start,
                      (long)local_88.stream.buffer.super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.stream.buffer.super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    _Unwind_Resume(uVar8);
  }
  local_58 = __return_storage_ptr__;
  if (this[0x8a] == (_anonymous_namespace_)0x1) {
    anon_unknown.dwarf_38779b::FilterAdapter::write
              (&local_88,(int)*(long *)(this + 0x40) + 0x18,
               (void *)((*(long *)(this + 0x48) - *(long *)(this + 0x40)) + -0x18),(size_t)filter);
    local_b0 = (*(long *)(this + 0x48) - *(long *)(this + 0x40)) + -0x18;
    this[0x8a] = (_anonymous_namespace_)0x0;
  }
  else {
    local_b0 = 0;
  }
  __n = *(size_t *)(this + 0x70);
  pvVar15 = (void *)(((*(long *)(this + 0x60) - __n) - *(long *)(this + 0x58)) + -0x18);
  anon_unknown.dwarf_38779b::FilterAdapter::write
            (&local_88,(int)__n + (int)*(long *)(this + 0x58) + 0x18,pvVar15,__n);
  *(long *)(this + 0x70) = *(long *)(this + 0x70) + (long)pvVar15;
  local_b0 = local_b0 + (long)pvVar15;
  psVar12 = *(shared_ptr<binlog::Session::Channel> **)(this + 0x28);
  psVar14 = *(shared_ptr<binlog::Session::Channel> **)(this + 0x30);
  if (psVar12 != psVar14) {
    local_50 = this + 0x90;
    local_48 = psVar14;
    do {
      p_Var1 = (psVar12->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
               _M_refcount._M_pi;
      if (p_Var1 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        bVar17 = false;
      }
      else {
        bVar17 = p_Var1->_M_use_count == 1;
      }
      peVar2 = (psVar12->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      _Var3.super__Head_base<0UL,_char_*,_false>._M_head_impl =
           (peVar2->_queue)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>;
      local_40 = *(void **)((long)_Var3.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x10);
      pvVar15 = *(void **)((long)_Var3.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x30);
      if (local_40 < pvVar15) {
        local_98 = (int)*(undefined8 *)
                         ((long)_Var3.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x28);
        pvVar16 = (void *)((long)*(void **)((long)_Var3.super__Head_base<0UL,_char_*,_false>.
                                                  _M_head_impl + 0x18) - (long)pvVar15);
        __buf = local_40;
        iVar4 = local_98;
        if (*(void **)((long)_Var3.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x18) <
            pvVar15 || pvVar16 == (void *)0x0) goto LAB_001a7909;
        iVar4 = (int)pvVar15 + local_98;
        pvVar15 = local_40;
        __buf = pvVar16;
      }
      else {
        __buf = (void *)((long)local_40 - (long)pvVar15);
        iVar4 = (int)pvVar15 +
                (int)*(undefined8 *)
                      ((long)_Var3.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x28);
LAB_001a7909:
        pvVar15 = (void *)0x0;
        local_98 = 0;
      }
      uVar13 = (long)pvVar15 + (long)__buf;
      local_38 = psVar12;
      if (uVar13 != 0) {
        (peVar2->writerProp).batchSize = uVar13;
        if (*(long *)(this + 0x98) != *(long *)(this + 0x90)) {
          *(long *)(this + 0x98) = *(long *)(this + 0x90);
        }
        __n_00 = this;
        sVar5 = binlog::
                serializeSizePrefixedTagged<binlog::WriterProp,binlog::detail::VectorOutputStream>
                          (&peVar2->writerProp,(VectorOutputStream *)local_50);
        anon_unknown.dwarf_38779b::FilterAdapter::write
                  (&local_88,(int)*(long *)(this + 0x90),
                   (void *)(*(long *)(this + 0x98) - *(long *)(this + 0x90)),(size_t)__n_00);
        anon_unknown.dwarf_38779b::FilterAdapter::write(&local_88,iVar4,__buf,(size_t)__n_00);
        if (pvVar15 != (void *)0x0) {
          anon_unknown.dwarf_38779b::FilterAdapter::write(&local_88,local_98,pvVar15,(size_t)__n_00)
          ;
        }
        *(void **)((long)_Var3.super__Head_base<0UL,_char_*,_false>._M_head_impl + 0x30) = local_40;
        local_b0 = uVar13 + local_b0 + sVar5;
      }
      psVar12 = local_38;
      psVar14 = local_48;
      if (bVar17) {
        p_Var1 = (local_38->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>
                 )._M_refcount._M_pi;
        (local_38->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             = (element_type *)0x0;
        (local_38->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
        }
      }
      psVar12 = psVar12 + 1;
    } while (psVar12 != psVar14);
    psVar12 = *(shared_ptr<binlog::Session::Channel> **)(this + 0x28);
    psVar14 = *(shared_ptr<binlog::Session::Channel> **)(this + 0x30);
  }
  uVar10 = (long)psVar14 - (long)psVar12;
  psVar6 = psVar12;
  uVar11 = uVar10;
  if (0 < (long)uVar10 >> 6) {
    psVar6 = (shared_ptr<binlog::Session::Channel> *)
             ((long)&(psVar12->
                     super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr + (uVar10 & 0xffffffffffffffc0));
    lVar9 = ((long)uVar10 >> 6) + 1;
    __first._M_current = psVar12 + 2;
    do {
      if (__first._M_current[-2].
          super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        __first._M_current = __first._M_current + -2;
        goto LAB_001a7a9d;
      }
      if (__first._M_current[-1].
          super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        __first._M_current = __first._M_current + -1;
        goto LAB_001a7a9d;
      }
      if (((__first._M_current)->
          super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
          (element_type *)0x0) goto LAB_001a7a9d;
      if (__first._M_current[1].
          super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        __first._M_current = __first._M_current + 1;
        goto LAB_001a7a9d;
      }
      lVar9 = lVar9 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar9);
    uVar11 = (long)psVar14 - (long)psVar6;
  }
  lVar9 = (long)uVar11 >> 4;
  if (lVar9 == 1) {
LAB_001a7a80:
    __first._M_current = psVar6;
    if ((psVar6->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
        (element_type *)0x0) {
      __first._M_current = psVar14;
    }
  }
  else if (lVar9 == 2) {
LAB_001a7a76:
    __first._M_current = psVar6;
    if ((psVar6->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
        (element_type *)0x0) {
      psVar6 = psVar6 + 1;
      goto LAB_001a7a80;
    }
  }
  else {
    __first._M_current = psVar14;
    if (lVar9 != 3) goto LAB_001a7af3;
    __first._M_current = psVar6;
    if ((psVar6->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
        (element_type *)0x0) {
      psVar6 = psVar6 + 1;
      goto LAB_001a7a76;
    }
  }
LAB_001a7a9d:
  psVar6 = __first._M_current + 1;
  if (psVar6 != psVar14 && __first._M_current != psVar14) {
    do {
      peVar2 = (psVar6->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      if (peVar2 != (element_type *)0x0) {
        p_Var1 = (psVar6->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
                 _M_refcount._M_pi;
        (psVar6->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             (element_type *)0x0;
        (psVar6->super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ((__first._M_current)->
        super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar2;
        this_00 = ((__first._M_current)->
                  super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        ((__first._M_current)->
        super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
             = p_Var1;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        __first._M_current = __first._M_current + 1;
      }
      psVar6 = psVar6 + 1;
    } while (psVar6 != psVar14);
    psVar12 = *(shared_ptr<binlog::Session::Channel> **)(this + 0x28);
    uVar10 = *(long *)(this + 0x30) - (long)psVar12;
  }
LAB_001a7af3:
  std::
  vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
  ::_M_erase((vector<std::shared_ptr<binlog::Session::Channel>,_std::allocator<std::shared_ptr<binlog::Session::Channel>_>_>
              *)(this + 0x28),__first,
             (shared_ptr<binlog::Session::Channel> *)
             ((long)&(psVar12->
                     super___shared_ptr<binlog::Session::Channel,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr + uVar10));
  *(long *)(this + 0x80) = *(long *)(this + 0x80) + local_b0;
  pthread_mutex_unlock((pthread_mutex_t *)this);
  streamToEvents_abi_cxx11_(local_58,&local_88.stream,"%S %m");
  ppuVar7 = &PTR__TestStream_001ebca8;
  local_88.stream.super_EntryStream._vptr_EntryStream = (_func_int **)&PTR__TestStream_001ebca8;
  if (local_88.stream.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.stream.buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.stream.buffer.super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.stream.buffer.super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    ppuVar7 = (undefined **)extraout_RAX;
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)ppuVar7;
}

Assistant:

std::vector<std::string> filterEvents(binlog::Session& session, binlog::EventFilter& filter)
{
  FilterAdapter adapter{filter, {}};
  session.consume(adapter);
  return streamToEvents(adapter.stream, "%S %m");
}